

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O3

void __thiscall leveldb::IteratorWrapper::Seek(IteratorWrapper *this,Slice *k)

{
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[5])();
    iVar1 = (*this->iter_->_vptr_Iterator[2])();
    this->valid_ = SUB41(iVar1,0);
    if (SUB41(iVar1,0) != false) {
      iVar1 = (*this->iter_->_vptr_Iterator[8])();
      (this->key_).data_ = (char *)CONCAT44(extraout_var,iVar1);
      (this->key_).size_ = extraout_RDX;
    }
    return;
  }
  __assert_fail("iter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator_wrapper.h"
                ,0x3e,"void leveldb::IteratorWrapper::Seek(const Slice &)");
}

Assistant:

void Seek(const Slice& k) {
    assert(iter_);
    iter_->Seek(k);
    Update();
  }